

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

int __thiscall FNodeBuilder::MarkLoop(FNodeBuilder *this,DWORD firstseg,int loopnum)

{
  int iVar1;
  sector_t_conflict *psVar2;
  FPrivVert *pFVar3;
  FPrivSeg *pFVar4;
  angle_t aVar5;
  angle_t aVar6;
  uint uVar7;
  FPrivSeg *pFVar8;
  uint uVar9;
  DWORD DVar10;
  
  pFVar8 = (this->Segs).Array;
  if (pFVar8[firstseg].loopnum == 0) {
    psVar2 = pFVar8[firstseg].frontsector;
    do {
      pFVar8[firstseg].loopnum = loopnum;
      iVar1 = pFVar8[firstseg].v2;
      pFVar3 = (this->Vertices).Array;
      DVar10 = pFVar3[iVar1].segs;
      aVar5 = PointToAngle(pFVar3[iVar1].super_FSimpleVert.x -
                           pFVar3[pFVar8[firstseg].v1].super_FSimpleVert.x,
                           pFVar3[iVar1].super_FSimpleVert.y -
                           pFVar3[pFVar8[firstseg].v1].super_FSimpleVert.y);
      firstseg = 0xffffffff;
      uVar9 = 0xffffffff;
      while (DVar10 != 0xffffffff) {
        pFVar4 = (this->Segs).Array;
        pFVar8 = pFVar4 + DVar10;
        if (pFVar4[DVar10].frontsector == psVar2) {
          pFVar3 = (this->Vertices).Array;
          aVar6 = PointToAngle(pFVar3[pFVar8->v1].super_FSimpleVert.x -
                               pFVar3[pFVar8->v2].super_FSimpleVert.x,
                               pFVar3[pFVar8->v1].super_FSimpleVert.y -
                               pFVar3[pFVar8->v2].super_FSimpleVert.y);
          uVar7 = aVar6 - aVar5;
          if (uVar7 != 0 && uVar7 < uVar9) {
            firstseg = DVar10;
            uVar9 = uVar7;
          }
        }
        DVar10 = pFVar8->nextforvert;
      }
    } while ((firstseg != 0xffffffff) &&
            (pFVar8 = (this->Segs).Array, pFVar8[firstseg].loopnum == 0));
    loopnum = loopnum + 1;
  }
  return loopnum;
}

Assistant:

int FNodeBuilder::MarkLoop (DWORD firstseg, int loopnum)
{
	DWORD seg;
	sector_t *sec = Segs[firstseg].frontsector;

	if (Segs[firstseg].loopnum != 0)
	{ // already marked
		return loopnum;
	}

	seg = firstseg;

	do
	{
		FPrivSeg *s1 = &Segs[seg];

		s1->loopnum = loopnum;

		P(Printf ("Mark seg %d (%d,%d)-(%d,%d)\n", seg,
				Vertices[s1->v1].x>>16, Vertices[s1->v1].y>>16,
				Vertices[s1->v2].x>>16, Vertices[s1->v2].y>>16));

		DWORD bestseg = DWORD_MAX;
		DWORD tryseg = Vertices[s1->v2].segs;
		angle_t bestang = ANGLE_MAX;
		angle_t ang1 = PointToAngle (Vertices[s1->v2].x - Vertices[s1->v1].x,
			Vertices[s1->v2].y - Vertices[s1->v1].y);

		while (tryseg != DWORD_MAX)
		{
			FPrivSeg *s2 = &Segs[tryseg];

			if (s2->frontsector == sec)
			{
				angle_t ang2 = PointToAngle (Vertices[s2->v1].x - Vertices[s2->v2].x,
					Vertices[s2->v1].y - Vertices[s2->v2].y);
				angle_t angdiff = ang2 - ang1;

				if (angdiff < bestang && angdiff > 0)
				{
					bestang = angdiff;
					bestseg = tryseg;
				}
			}
			tryseg = s2->nextforvert;
		}

		seg = bestseg;
	} while (seg != DWORD_MAX && Segs[seg].loopnum == 0);

	return loopnum + 1;
}